

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O3

void __thiscall CVmObjGramProd::mark_undo_ref(CVmObjGramProd *this,CVmUndoRecord *undo_rec)

{
  vmgram_alt_info *alt;
  vmgram_undo_rec *rec;
  
  if (((undo_rec->id).ptrval != (void *)0x0) &&
     (alt = *(vmgram_alt_info **)((long)(undo_rec->id).ptrval + 8), alt != (vmgram_alt_info *)0x0))
  {
    mark_alt_refs(this,alt,2);
    return;
  }
  return;
}

Assistant:

void CVmObjGramProd::mark_undo_ref(VMG_ CVmUndoRecord *undo_rec)
{
    /* check for our private record type */
    if (undo_rec->id.ptrval != 0)
    {
        /* get our private undo record, properly cast */
        vmgram_undo_rec *rec = (vmgram_undo_rec *)undo_rec->id.ptrval;

        /* if it record an alternative, mark its references */
        if (rec->alt != 0)
            mark_alt_refs(vmg_ rec->alt, VMOBJ_REACHABLE);
    }
}